

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

wchar_t fl_utf8test(char *src,uint srclen)

{
  wchar_t local_34;
  char *pcStack_30;
  wchar_t len;
  char *e;
  char *p;
  wchar_t ret;
  uint srclen_local;
  char *src_local;
  
  p._0_4_ = L'\x01';
  pcStack_30 = src + srclen;
  e = src;
  p._4_4_ = srclen;
  _ret = src;
  while( true ) {
    while( true ) {
      if (pcStack_30 <= e) {
        return (wchar_t)p;
      }
      if (((int)*e & 0x80U) != 0) break;
      e = e + 1;
    }
    fl_utf8decode(e,pcStack_30,&local_34);
    if (local_34 < L'\x02') break;
    if ((wchar_t)p < local_34) {
      p._0_4_ = local_34;
    }
    e = e + local_34;
  }
  return L'\0';
}

Assistant:

int fl_utf8test(const char* src, unsigned srclen) {
  int ret = 1;
  const char* p = src;
  const char* e = src+srclen;
  while (p < e) {
    if (*p & 0x80) {
      int len; fl_utf8decode(p,e,&len);
      if (len < 2) return 0;
      if (len > ret) ret = len;
      p += len;
    } else {
      p++;
    }
  }
  return ret;
}